

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall
fmt::v8::detail::format_error_code
          (detail *this,buffer<char> *out,int error_code,string_view message)

{
  uint uVar1;
  ulong uVar2;
  error_handler *peVar3;
  uint uVar4;
  undefined4 in_register_00000014;
  error_handler *this_00;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  undefined1 local_58 [16];
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  buffer<char>::try_resize((buffer<char> *)this,0);
  uVar2 = (ulong)(uint)-(int)out;
  if (0 < (int)out) {
    uVar2 = (ulong)out & 0xffffffff;
  }
  uVar4 = (uint)uVar2 | 1;
  uVar1 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  if (message.data_ <=
      (char *)(0x1ec - ((((ulong)out & 0xffffffff) >> 0x1f) +
                       (uVar2 + *(long *)(count_digits_inc(int)::table + (ulong)uVar1 * 8) >> 0x20))
              )) {
    local_58._0_8_ = "{}{}";
    local_58._8_8_ = 4;
    local_48._0_4_ = 0;
    local_48._4_4_ = 2;
    local_40 = 
    parse_format_specs<fmt::v8::basic_string_view<char>,fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>
    ;
    local_38 = 
    parse_format_specs<char[3],fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>
    ;
    peVar3 = (error_handler *)0x13e6a4;
    while (this_00 = peVar3, this_00 != (error_handler *)0x13e6a8) {
      peVar3 = this_00 + 1;
      if (*this_00 == (error_handler)0x7d) {
        if ((peVar3 == (error_handler *)0x13e6a8) || (*peVar3 != (error_handler)0x7d))
        goto LAB_00134b65;
        peVar3 = this_00 + 2;
      }
      else if (*this_00 == (error_handler)0x7b) {
        peVar3 = (error_handler *)
                 parse_replacement_field<char,fmt::v8::detail::format_string_checker<char,fmt::v8::detail::error_handler,fmt::v8::basic_string_view<char>,char[3]>&>
                           ((char *)this_00,"",
                            (format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
                             *)local_58);
      }
    }
    local_48 = ": ";
    fmt.size_ = 4;
    fmt.data_ = "{}{}";
    args.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_58;
    args.desc_ = 0xcd;
    local_58._0_8_ = (char *)CONCAT44(in_register_00000014,error_code);
    local_58._8_8_ = message.data_;
    vformat_to<fmt::v8::appender,_0>((appender)this,fmt,args);
  }
  local_58._0_8_ = "{}{}";
  local_58._8_8_ = 4;
  local_48._0_4_ = 0;
  local_48._4_4_ = 2;
  local_40 = 
  parse_format_specs<char[7],fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>
  ;
  local_38 = 
  parse_format_specs<int,fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>
  ;
  peVar3 = (error_handler *)0x13e6a4;
  while( true ) {
    while( true ) {
      this_00 = peVar3;
      if (this_00 == (error_handler *)0x13e6a8) {
        local_48 = (char *)((ulong)out & 0xffffffff);
        local_58._0_8_ = "error ";
        fmt_00.size_ = 4;
        fmt_00.data_ = "{}{}";
        args_00.field_1.values_ =
             (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_58;
        args_00.desc_ = 0x1c;
        vformat_to<fmt::v8::appender,_0>((appender)this,fmt_00,args_00);
        return;
      }
      peVar3 = this_00 + 1;
      if (*this_00 == (error_handler)0x7d) break;
      if (*this_00 == (error_handler)0x7b) {
        peVar3 = (error_handler *)
                 parse_replacement_field<char,fmt::v8::detail::format_string_checker<char,fmt::v8::detail::error_handler,char[7],int>&>
                           ((char *)this_00,"",
                            (format_string_checker<char,_fmt::v8::detail::error_handler,_char[7],_int>
                             *)local_58);
      }
    }
    if ((peVar3 == (error_handler *)0x13e6a8) || (*peVar3 != (error_handler)0x7d)) break;
    peVar3 = this_00 + 2;
  }
LAB_00134b65:
  error_handler::on_error(this_00,"unmatched \'}\' in format string");
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    format_to(it, FMT_STRING("{}{}"), message, SEP);
  format_to(it, FMT_STRING("{}{}"), ERROR_STR, error_code);
  FMT_ASSERT(out.size() <= inline_buffer_size, "");
}